

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O0

InputMap * Omega_h::any_cast<Omega_h::InputMap&&>(any *operand)

{
  InputMap *pIVar1;
  bad_any_cast *this;
  InputMap *p;
  any *operand_local;
  
  pIVar1 = any_cast<Omega_h::InputMap>(operand);
  if (pIVar1 == (InputMap *)0x0) {
    this = (bad_any_cast *)__cxa_allocate_exception(8);
    memset(this,0,8);
    bad_any_cast::bad_any_cast(this);
    __cxa_throw(this,&bad_any_cast::typeinfo,bad_any_cast::~bad_any_cast);
  }
  pIVar1 = detail::any_cast_move_if_true<Omega_h::InputMap&&>(pIVar1);
  return pIVar1;
}

Assistant:

inline ValueType any_cast(any&& operand) {
  // https://cplusplus.github.io/LWG/lwg-active.html#2509
  using can_move = std::integral_constant<bool,
      std::is_move_constructible<ValueType>::value &&
          !std::is_lvalue_reference<ValueType>::value>;

  auto p = any_cast<typename std::remove_reference<ValueType>::type>(&operand);
  if (p == nullptr) throw bad_any_cast();
  return detail::any_cast_move_if_true<ValueType>(p, can_move());
}